

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void divide_subset_split(size_t *ix_arr,int *x,size_t st,size_t end,char *split_categ,int ncat,
                        MissingAction missing_action,NewCategAction new_cat_action,
                        bool move_new_to_left,size_t *st_NA,size_t *end_NA,size_t *split_ix)

{
  size_t sVar1;
  size_t row;
  uint uVar2;
  int iVar3;
  size_t row_1;
  ulong uVar4;
  size_t row_3;
  
  if (new_cat_action != Weighted && missing_action == Fail) {
    uVar4 = st;
    if (move_new_to_left && new_cat_action == Smallest) {
      for (; st <= end; st = st + 1) {
        if (((ncat <= x[ix_arr[st]]) || (split_categ[x[ix_arr[st]]] == -1)) ||
           (split_categ[x[ix_arr[st]]] == '\x01')) {
          sVar1 = ix_arr[uVar4];
          ix_arr[uVar4] = ix_arr[st];
          ix_arr[st] = sVar1;
          uVar4 = uVar4 + 1;
        }
      }
    }
    else if (new_cat_action == Random) {
      for (; st <= end; st = st + 1) {
        iVar3 = x[ix_arr[st]];
        if (ncat <= iVar3) {
          iVar3 = iVar3 % ncat;
        }
        if (split_categ[iVar3] == '\x01') {
          sVar1 = ix_arr[uVar4];
          ix_arr[uVar4] = ix_arr[st];
          ix_arr[st] = sVar1;
          uVar4 = uVar4 + 1;
        }
      }
    }
    else {
      for (; st <= end; st = st + 1) {
        if ((x[ix_arr[st]] < ncat) && (split_categ[x[ix_arr[st]]] == '\x01')) {
          sVar1 = ix_arr[uVar4];
          ix_arr[uVar4] = ix_arr[st];
          ix_arr[st] = sVar1;
          uVar4 = uVar4 + 1;
        }
      }
    }
    goto LAB_00144f40;
  }
  split_ix = end_NA;
  if (new_cat_action == Smallest) {
    uVar4 = st;
    if (!move_new_to_left) goto LAB_00144d5f;
    for (; uVar4 <= end; uVar4 = uVar4 + 1) {
      iVar3 = x[ix_arr[uVar4]];
      if ((-1 < (long)iVar3) &&
         (((ncat <= iVar3 || (split_categ[iVar3] == -1)) || (split_categ[iVar3] == '\x01')))) {
        sVar1 = ix_arr[st];
        ix_arr[st] = ix_arr[uVar4];
        ix_arr[uVar4] = sVar1;
        st = st + 1;
      }
    }
  }
  else {
    if (new_cat_action == Random) {
      uVar4 = st;
      if (missing_action == Impute && !move_new_to_left) {
        for (; uVar4 <= end; uVar4 = uVar4 + 1) {
          uVar2 = x[ix_arr[uVar4]];
          if (ncat <= (int)uVar2) {
            uVar2 = (int)uVar2 % ncat;
          }
          if (((int)uVar2 < 0) || (split_categ[uVar2] == '\x01')) {
            sVar1 = ix_arr[st];
            ix_arr[st] = ix_arr[uVar4];
            ix_arr[uVar4] = sVar1;
            st = st + 1;
          }
        }
      }
      else {
        for (; uVar4 <= end; uVar4 = uVar4 + 1) {
          uVar2 = x[ix_arr[uVar4]];
          if (ncat <= (int)uVar2) {
            uVar2 = (int)uVar2 % ncat;
          }
          if ((-1 < (int)uVar2) && (split_categ[uVar2] == '\x01')) {
            sVar1 = ix_arr[st];
            ix_arr[st] = ix_arr[uVar4];
            ix_arr[uVar4] = sVar1;
            st = st + 1;
          }
        }
      }
      *st_NA = st;
      uVar4 = st;
      if (missing_action != Impute || move_new_to_left) {
        for (; st <= end; st = st + 1) {
          if (x[ix_arr[st]] < 0) {
            sVar1 = ix_arr[uVar4];
            ix_arr[uVar4] = ix_arr[st];
            ix_arr[st] = sVar1;
            uVar4 = uVar4 + 1;
          }
        }
      }
      goto LAB_00144f40;
    }
LAB_00144d5f:
    uVar4 = st;
    if (missing_action == Impute && !move_new_to_left) {
      for (; uVar4 <= end; uVar4 = uVar4 + 1) {
        uVar2 = x[ix_arr[uVar4]];
        if (((int)uVar2 < ncat) && (((int)uVar2 < 0 || (split_categ[uVar2] == '\x01')))) {
          sVar1 = ix_arr[st];
          ix_arr[st] = ix_arr[uVar4];
          ix_arr[uVar4] = sVar1;
          st = st + 1;
        }
      }
    }
    else {
      for (; uVar4 <= end; uVar4 = uVar4 + 1) {
        uVar2 = x[ix_arr[uVar4]];
        if (((int)uVar2 < ncat && -1 < (int)uVar2) && (split_categ[uVar2] == '\x01')) {
          sVar1 = ix_arr[st];
          ix_arr[st] = ix_arr[uVar4];
          ix_arr[uVar4] = sVar1;
          st = st + 1;
        }
      }
    }
  }
  *st_NA = st;
  uVar4 = st;
  if (missing_action == Divide && new_cat_action == Weighted) {
    for (; st <= end; st = st + 1) {
      uVar2 = x[ix_arr[st]];
      if ((ncat <= (int)uVar2 || (int)uVar2 < 0) || (split_categ[uVar2] == -1)) {
        sVar1 = ix_arr[uVar4];
        ix_arr[uVar4] = ix_arr[st];
        ix_arr[st] = sVar1;
        uVar4 = uVar4 + 1;
      }
    }
  }
  else if (new_cat_action == Weighted) {
    for (; st <= end; st = st + 1) {
      iVar3 = x[ix_arr[st]];
      if ((-1 < (long)iVar3) && ((ncat <= iVar3 || (split_categ[iVar3] == -1)))) {
        sVar1 = ix_arr[uVar4];
        ix_arr[uVar4] = ix_arr[st];
        ix_arr[st] = sVar1;
        uVar4 = uVar4 + 1;
      }
    }
  }
  else if (missing_action == Divide) {
    for (; st <= end; st = st + 1) {
      if (x[ix_arr[st]] < 0) {
        sVar1 = ix_arr[uVar4];
        ix_arr[uVar4] = ix_arr[st];
        ix_arr[st] = sVar1;
        uVar4 = uVar4 + 1;
      }
    }
  }
LAB_00144f40:
  *split_ix = uVar4;
  return;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, int x[], size_t st, size_t end, signed char split_categ[],
                         int ncat, MissingAction missing_action, NewCategAction new_cat_action,
                         bool move_new_to_left, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    size_t temp;
    int cval;

    /* if NAs are not to be bothered with, just need to do a single pass */
    if (missing_action == Fail && new_cat_action != Weighted)
    {
        /* in this case, will need to fill 'split_ix', otherwise need to fill 'st_NA' and 'end_NA' */
        if (new_cat_action == Smallest && move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval >= ncat || split_categ[cval] == 1 || split_categ[cval] == (-1))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else if (new_cat_action == Random)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                cval = (cval >= ncat)? (cval % ncat) : cval;
                if (split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval < ncat && split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        split_ix = st;
    }

    /* if there are new categories, and their direction was decided at random,
       can just reuse what was randomly decided for previous columns by taking
       a remainder w.r.t. the number of previous columns. Note however that this
       will not be an unbiased decision if the model used a gain criterion. */
    else if (new_cat_action == Random)
    {
        if (missing_action == Impute && !move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                cval = (cval >= ncat)? (cval % ncat) : cval;
                if (cval < 0 || split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                cval = (cval >= ncat)? (cval % ncat) : cval;
                if (cval >= 0 && split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }
        st_NA = st;

        if (!(missing_action == Impute && !move_new_to_left))
        {
            for (size_t row = st; row <= end; row++)
            {
                if (unlikely(x[ix_arr[row]] < 0))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }
        end_NA = st;
    }

    /* otherwise, first put to the left all l.e. and not NA, then all NAs to the end of the left */
    else
    {
        /* Note: if having 'new_cat_action'='Smallest' and 'missing_action'='Impute', missing values
           and new categories will necessarily go into different branches, thus it's possible to do
           all the movements in one pass if certain conditions match. */

        if (new_cat_action == Smallest && move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval >= 0 && (cval >= ncat || split_categ[cval] == 1 || split_categ[cval] == (-1)))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else if (missing_action == Impute && !move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval < ncat && (cval < 0 || split_categ[cval] == 1))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval >= 0 && cval < ncat && split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        st_NA = st;

        if (new_cat_action == Weighted && missing_action == Divide)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval < 0 || cval >= ncat || split_categ[cval] == (-1))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else if (new_cat_action == Weighted)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval >= 0 && (cval >= ncat || split_categ[cval] == (-1)))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else if (missing_action == Divide)
        {
            for (size_t row = st; row <= end; row++)
            {
                if (unlikely(x[ix_arr[row]] < 0))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        end_NA = st;
    }
}